

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaTypePtr xmlSchemaInitBasicType(char *name,xmlSchemaValType type,xmlSchemaTypePtr baseType)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  xmlSchemaTypePtr __s;
  xmlSchemaFacetPtr pxVar4;
  xmlSchemaValPtr pxVar5;
  
  uVar2 = (ulong)type;
  __s = (xmlSchemaTypePtr)(*xmlMalloc)(0xe0);
  if (__s == (xmlSchemaTypePtr)0x0) {
    xmlSchemaTypeErrMemory((xmlNodePtr)0x0,"could not initialize basic types");
    return (xmlSchemaTypePtr)0x0;
  }
  memset(__s,0,0xe0);
  __s->name = (xmlChar *)name;
  __s->targetNamespace = (xmlChar *)"http://www.w3.org/2001/XMLSchema";
  __s->type = XML_SCHEMA_TYPE_BASIC;
  __s->baseType = baseType;
  __s->contentType = XML_SCHEMA_CONTENT_BASIC;
  iVar3 = 0x100;
  if (type < (XML_SCHEMAS_ANYSIMPLETYPE|XML_SCHEMAS_STRING)) {
    if ((0x18003020fffaU >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0xa080000UL >> (uVar2 & 0x3f) & 1) != 0) {
        __s->flags = 0x40;
        pxVar4 = xmlSchemaNewFacet();
        if (pxVar4 == (xmlSchemaFacetPtr)0x0) {
LAB_001c60a2:
          pxVar4 = (xmlSchemaFacetPtr)0x0;
        }
        else {
          pxVar4->type = XML_SCHEMA_FACET_MINLENGTH;
          pxVar5 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
          if (pxVar5 == (xmlSchemaValPtr)0x0) {
            pxVar4->val = (xmlSchemaValPtr)0x0;
            (*xmlFree)(pxVar4);
            goto LAB_001c60a2;
          }
          *(undefined8 *)pxVar5 = 0;
          pxVar5->next = (_xmlSchemaVal *)0x0;
          (pxVar5->value).decimal.hi = 0;
          *(undefined8 *)((long)&pxVar5->value + 0x18) = 0;
          (pxVar5->value).decimal.lo = 0;
          (pxVar5->value).decimal.mi = 0;
          pxVar5->type = XML_SCHEMAS_NNINTEGER;
          pxVar4->val = pxVar5;
          (pxVar5->value).decimal.lo = 1;
        }
        __s->facets = pxVar4;
        pbVar1 = (byte *)((long)&__s->flags + 3);
        *pbVar1 = *pbVar1 | 8;
        name = (char *)__s->name;
        goto LAB_001c5fea;
      }
      if ((0x600000000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_001c5fea;
    }
    else {
      iVar3 = 0x4100;
    }
  }
  __s->flags = iVar3;
LAB_001c5fea:
  xmlHashAddEntry2(xmlSchemaTypesBank,(xmlChar *)name,(xmlChar *)"http://www.w3.org/2001/XMLSchema",
                   __s);
  __s->builtInType = type;
  return __s;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaInitBasicType(const char *name, xmlSchemaValType type,
		       xmlSchemaTypePtr baseType) {
    xmlSchemaTypePtr ret;

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaTypeErrMemory(NULL, "could not initialize basic types");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->name = (const xmlChar *)name;
    ret->targetNamespace = XML_SCHEMAS_NAMESPACE_NAME;
    ret->type = XML_SCHEMA_TYPE_BASIC;
    ret->baseType = baseType;
    ret->contentType = XML_SCHEMA_CONTENT_BASIC;
    /*
    * Primitive types.
    */
    switch (type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_DECIMAL:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	case XML_SCHEMAS_BOOLEAN:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_HEXBINARY:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    ret->flags |= XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE;
	    break;
	default:
	    break;
    }
    /*
    * Set variety.
    */
    switch (type) {
	case XML_SCHEMAS_ANYTYPE:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	    break;
	case XML_SCHEMAS_IDREFS:
	case XML_SCHEMAS_NMTOKENS:
	case XML_SCHEMAS_ENTITIES:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    ret->facets = xmlSchemaNewMinLengthFacet(1);
	    ret->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;
	    break;
	default:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	    break;
    }
    xmlHashAddEntry2(xmlSchemaTypesBank, ret->name,
	             XML_SCHEMAS_NAMESPACE_NAME, ret);
    ret->builtInType = type;
    return(ret);
}